

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMI_ALG_RSA_SCHEME_Unmarshal
                 (TPMI_ALG_RSA_SCHEME *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  TVar3 = 0x9a;
  if (1 < iVar1) {
    UVar2 = ByteArrayToUint16(*buffer);
    *target = UVar2;
    *buffer = *buffer + 2;
    if ((*target - 0x14 < 4) || ((TVar3 = 0x84, *target == 0x10 && (flag != 0)))) {
      TVar3 = 0;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMI_ALG_RSA_SCHEME_Unmarshal(TPMI_ALG_RSA_SCHEME *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ALG_RSAES
        case TPM_ALG_RSAES:
#endif // ALG_RSAES
#if         ALG_OAEP
        case TPM_ALG_OAEP:
#endif // ALG_OAEP
#if         ALG_RSASSA
        case TPM_ALG_RSASSA:
#endif // ALG_RSASSA
#if         ALG_RSAPSS
        case TPM_ALG_RSAPSS:
#endif // ALG_RSAPSS
            break;
        case TPM_ALG_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}